

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O0

bool __thiscall
MeCab::EncoderFeatureIndex::save(EncoderFeatureIndex *this,char *filename,char *header)

{
  byte bVar1;
  bool bVar2;
  pointer ppVar3;
  ostream *poVar4;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  const_iterator it;
  ofstream ofs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd28;
  ios_base *in_stack_fffffffffffffd30;
  long lVar5;
  _Self local_250;
  _Self local_248;
  undefined4 local_23c;
  long local_238 [64];
  byte local_36;
  die local_35 [19];
  byte local_22;
  die local_21;
  char *local_20;
  char *local_18;
  byte local_1;
  
  local_22 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (in_RDX == (char *)0x0) {
    die::die(&local_21);
    local_22 = 1;
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x29d);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"header");
    poVar4 = std::operator<<(poVar4,"] ");
    die::operator&(&local_21,poVar4);
  }
  if ((local_22 & 1) != 0) {
    die::~die((die *)0x16f73a);
  }
  local_36 = 0;
  if (*(long *)(in_RDI + 0x168) == 0) {
    die::die(local_35);
    local_36 = 1;
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x29e);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"alpha_");
    poVar4 = std::operator<<(poVar4,"] ");
    die::operator&(local_35,poVar4);
  }
  if ((local_36 & 1) != 0) {
    die::~die((die *)0x16f830);
  }
  std::ofstream::ofstream(local_238,local_18,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)local_238 + *(long *)(local_238[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::ios_base::setf(in_stack_fffffffffffffd30,
                        (fmtflags)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                        (fmtflags)in_stack_fffffffffffffd28);
    std::ios_base::precision((ios_base *)((long)local_238 + *(long *)(local_238[0] + -0x18)),0x10);
    std::operator<<((ostream *)local_238,local_20);
    std::ostream::operator<<(local_238,std::endl<char,std::char_traits<char>>);
    local_248._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::begin(in_stack_fffffffffffffd18);
    while( true ) {
      local_250._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end(in_stack_fffffffffffffd18);
      bVar2 = std::operator!=(&local_248,&local_250);
      if (!bVar2) break;
      lVar5 = *(long *)(in_RDI + 0x168);
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                             *)0x16fa01);
      poVar4 = (ostream *)
               std::ostream::operator<<(local_238,*(double *)(lVar5 + (long)ppVar3->second * 8));
      poVar4 = std::operator<<(poVar4,'\t');
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                             *)0x16fa49);
      poVar4 = std::operator<<(poVar4,(string *)ppVar3);
      std::operator<<(poVar4,'\n');
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                    *)poVar4);
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  local_23c = 1;
  std::ofstream::~ofstream(local_238);
  return (bool)(local_1 & 1);
}

Assistant:

bool EncoderFeatureIndex::save(const char *filename, const char *header) const {
  CHECK_DIE(header);
  CHECK_DIE(alpha_);

  std::ofstream ofs(WPATH(filename));
  if (!ofs) {
    return false;
  }

  ofs.setf(std::ios::fixed, std::ios::floatfield);
  ofs.precision(16);

  ofs << header;
  ofs << std::endl;

  for (std::map<std::string, int>::const_iterator it = dic_.begin();
       it != dic_.end(); ++it) {
    ofs << alpha_[it->second] << '\t' << it->first << '\n';
  }

  return true;
}